

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

Array<kj::String> * __thiscall
kj::anon_unknown_35::InMemoryDirectory::listNames
          (Array<kj::String> *__return_storage_ptr__,InMemoryDirectory *this)

{
  String *pSVar1;
  _Base_ptr p_Var2;
  Array<kj::String> *result;
  _Rb_tree_header *p_Var3;
  ArrayBuilder<kj::String> builder;
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  String *local_70;
  String local_48;
  
  kj::_::Mutex::lock(&(this->impl).mutex,SHARED);
  pSVar1 = (String *)
           kj::_::HeapArrayDisposer::allocateImpl
                     (0x18,0,(this->impl).value.entries._M_t._M_impl.super__Rb_tree_header.
                             _M_node_count,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  p_Var2 = *(_Base_ptr *)
            ((long)&(this->impl).value.entries._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  p_Var3 = &(this->impl).value.entries._M_t._M_impl.super__Rb_tree_header;
  local_70 = pSVar1;
  if ((_Rb_tree_header *)p_Var2 != p_Var3) {
    do {
      heapString(&local_48,*(char **)(p_Var2 + 1),
                 (size_t)((long)&p_Var2[1]._M_parent[-1]._M_right + 7));
      (local_70->content).ptr = local_48.content.ptr;
      (local_70->content).size_ = local_48.content.size_;
      (local_70->content).disposer = local_48.content.disposer;
      local_70 = local_70 + 1;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  __return_storage_ptr__->ptr = pSVar1;
  __return_storage_ptr__->size_ = ((long)local_70 - (long)pSVar1 >> 3) * -0x5555555555555555;
  __return_storage_ptr__->disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  kj::_::Mutex::unlock(&(this->impl).mutex,SHARED);
  return __return_storage_ptr__;
}

Assistant:

Array<String> listNames() const override {
    auto lock = impl.lockShared();
    return KJ_MAP(e, lock->entries) { return heapString(e.first); };
  }